

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall mjs::parser::parse_primary_expression(parser *this)

{
  uint uVar1;
  long lVar2;
  token_type tVar3;
  bool bVar4;
  pointer ppVar5;
  undefined4 uVar6;
  __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
  _Var7;
  ulong uVar8;
  ulong uVar9;
  wostream *pwVar11;
  char *in_RCX;
  expression *extraout_RDX;
  expression *extraout_RDX_00;
  expression *extraout_RDX_01;
  expression *peVar12;
  wchar_t *pwVar13;
  wstring_view *s;
  pointer *__ptr_1;
  int __fd;
  parser *in_RSI;
  token *this_00;
  wchar_t *in_R9;
  property_name_and_value *ppVar14;
  bool bVar15;
  bool bVar16;
  wstring_view wVar17;
  pointer *__ptr;
  property_name_and_value_list elements_1;
  wstring new_item_str;
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  elements;
  token id;
  wostringstream _oss;
  vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_> local_338;
  wstring local_318;
  size_type *local_2f8;
  _Alloc_hider local_2f0;
  size_type local_2e8 [2];
  undefined1 local_2d8 [48];
  undefined1 local_2a8 [40];
  undefined1 local_280 [376];
  undefined1 local_108 [40];
  undefined1 local_e0 [56];
  token local_a8;
  token local_80;
  token local_58;
  ulong uVar10;
  
  __fd = (int)in_RSI;
  accept((parser *)local_2a8,__fd,(sockaddr *)0x2,(socklen_t *)in_RCX);
  if ((local_2a8._0_4_ == identifier) || (local_2a8._0_4_ == string_literal)) {
    make_expression<mjs::identifier_expression,std::__cxx11::wstring_const&>
              (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                    in_RSI);
  }
  else {
    if (local_2a8._0_4_ != eof) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    accept((parser *)local_280,__fd,(sockaddr *)0x65,(socklen_t *)in_RCX);
    uVar6 = local_280._0_4_;
    token::destroy((token *)local_280);
    if (uVar6 == 0x72) {
      if ((int)in_RSI->version_ < 1) {
        bVar15 = false;
      }
      else {
        accept((parser *)local_e0,__fd,(sockaddr *)0x32,(socklen_t *)in_RCX);
        bVar15 = local_e0._0_4_ != 0x72;
        token::destroy((token *)local_e0);
      }
      if (bVar15) {
        local_2d8._0_8_ = (element_type *)0x0;
        local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2d8._16_8_ = (pointer)0x0;
        bVar15 = false;
LAB_0018e43a:
        accept((parser *)local_280,__fd,(sockaddr *)0x33,(socklen_t *)in_RCX);
        uVar6 = local_280._0_4_;
        token::destroy((token *)local_280);
        if (uVar6 == 0x72) {
          accept((parser *)local_280,__fd,(sockaddr *)0x20,(socklen_t *)in_RCX);
          uVar6 = local_280._0_4_;
          token::destroy((token *)local_280);
          bVar16 = uVar6 == 0x72;
          if (!bVar16) goto LAB_0018e4d0;
          if (bVar15) {
            in_RCX = "parse_primary_expression";
            expect(&local_58,in_RSI,comma,"parse_primary_expression",0x1da);
            token::destroy(&local_58);
          }
          parse_assignment_expression((parser *)local_280);
          std::
          vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
          ::emplace_back<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                    ((vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
                      *)local_2d8,
                     (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_280
                    );
          goto LAB_0018e4f3;
        }
        make_expression<mjs::array_literal_expression,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                  (this,(vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                         *)in_RSI);
        std::
        vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                   *)local_2d8);
      }
      else {
        if ((int)in_RSI->version_ < 1) {
          bVar15 = false;
        }
        else {
          accept((parser *)local_2d8,__fd,(sockaddr *)0x30,(socklen_t *)in_RCX);
          bVar15 = local_2d8._0_4_ != L'r';
          token::destroy((token *)local_2d8);
        }
        if (bVar15) {
          local_338.
          super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_338.
          super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_338.
          super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while( true ) {
            accept((parser *)local_280,__fd,(sockaddr *)0x31,(socklen_t *)in_RCX);
            uVar6 = local_280._0_4_;
            token::destroy((token *)local_280);
            if (uVar6 != 0x72) break;
            if (local_338.
                super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_338.
                super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              in_RCX = "parse_primary_expression";
              expect(&local_80,in_RSI,comma,"parse_primary_expression",0x1e6);
              token::destroy(&local_80);
              if ((int)in_RSI->version_ < 2) {
                bVar15 = false;
              }
              else {
                accept((parser *)local_108,__fd,(sockaddr *)0x31,(socklen_t *)in_RCX);
                bVar15 = local_108._0_4_ != eof;
                token::destroy((token *)local_108);
              }
              if (bVar15) break;
            }
            parse_property_name_and_value((property_name_and_value *)local_280,in_RSI);
            std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ::emplace_back<mjs::property_name_and_value>
                      (&local_338,(property_name_and_value *)local_280);
            peVar12 = extraout_RDX;
            if ((parser *)local_280._16_8_ != (parser *)0x0) {
              (**(code **)(*(long *)local_280._16_8_ + 8))();
              peVar12 = extraout_RDX_00;
            }
            local_280._16_8_ = (parser *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (**(code **)(*(long *)local_280._8_8_ + 8))();
              peVar12 = extraout_RDX_01;
            }
            ppVar5 = local_338.
                     super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (1 < (int)in_RSI->version_) {
              property_name_string_abi_cxx11_
                        ((wstring *)&local_2f8,
                         (mjs *)local_338.
                                super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].name_._M_t.
                                super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,
                         peVar12);
              local_280._8_8_ = ppVar5 + -1;
              ppVar14 = local_338.
                        super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
              local_280._0_8_ = (element_type *)&local_2f8;
              local_280._16_8_ = in_RSI;
              _Var7 = std::
                      __find_if<__gnu_cxx::__normal_iterator<mjs::property_name_and_value*,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>,__gnu_cxx::__ops::_Iter_pred<mjs::parser::parse_primary_expression()::_lambda(mjs::property_name_and_value_const&)_1_>>
                                (local_338.
                                 super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                 ._M_impl.super__Vector_impl_data._M_start,ppVar14);
              if (_Var7._M_current != ppVar14) {
                std::__cxx11::wostringstream::wostringstream((wostringstream *)local_280);
                pwVar11 = std::operator<<((wostream *)local_280,
                                          "Invalid redefinition of property: \"");
                local_e0._40_8_ = local_2f0._M_p;
                local_e0._48_8_ = local_2f8;
                cpp_quote_abi_cxx11_(&local_318,(mjs *)(local_e0 + 0x28),s);
                pwVar11 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                    (pwVar11,local_318._M_dataplus._M_p,local_318._M_string_length);
                std::operator<<(pwVar11,"\"");
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_318._M_dataplus._M_p != &local_318.field_2) {
                  operator_delete(local_318._M_dataplus._M_p,
                                  local_318.field_2._M_allocated_capacity * 4 + 4);
                }
                peVar12 = local_338.
                          super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].name_._M_t.
                          super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                          .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
                std::__cxx11::wstringbuf::str();
                wVar17._M_str = in_R9;
                wVar17._M_len = (size_t)local_318._M_dataplus._M_p;
                syntax_error((parser *)"parse_primary_expression",(char *)0x207,(int)peVar12 + 8,
                             (source_extend *)local_318._M_string_length,wVar17);
              }
              if (local_2f8 != local_2e8) {
                operator_delete(local_2f8,local_2e8[0] * 4 + 4);
              }
            }
          }
          make_expression<mjs::object_literal_expression,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>
                    (this,(vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                           *)in_RSI);
          std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
          ~vector(&local_338);
        }
        else if (((int)in_RSI->version_ < 1) ||
                ((tVar3 = (in_RSI->current_token_).type_, tVar3 != divide && (tVar3 != divideequal))
                )) {
          accept((parser *)local_280,__fd,(sockaddr *)0x2e,(socklen_t *)in_RCX);
          uVar6 = local_280._0_4_;
          token::destroy((token *)local_280);
          if (uVar6 == 0x72) {
            tVar3 = (in_RSI->current_token_).type_;
            uVar1 = tVar3 - false_;
            if (((0x21 < uVar1) || ((0x200040001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
               (1 < tVar3 - numeric_literal)) {
              token::destroy((token *)local_2a8);
              unhandled(in_RSI,"parse_primary_expression",0x21e);
            }
            check_literal(in_RSI);
            get_token((token *)local_280,in_RSI);
            make_expression<mjs::literal_expression,mjs::token>(this,(token *)in_RSI);
            this_00 = (token *)local_280;
          }
          else {
            parse_expression(this);
            expect(&local_a8,in_RSI,rparen,"parse_primary_expression",0x218);
            this_00 = &local_a8;
          }
          token::destroy(this_00);
        }
        else {
          wVar17 = lexer::get_regex_literal(&in_RSI->lexer_);
          pwVar13 = wVar17._M_str;
          uVar8 = wVar17._M_len;
          check_token(in_RSI);
          skip_whitespace(in_RSI);
          if (uVar8 < 3) {
            __assert_fail("lit.size() >= 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                          ,0x211,"expression_ptr mjs::parser::parse_primary_expression()");
          }
          uVar10 = uVar8;
          if (*pwVar13 != L'/') {
            __assert_fail("lit[0] == \'/\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                          ,0x212,"expression_ptr mjs::parser::parse_primary_expression()");
          }
          do {
            uVar9 = uVar10 - 1;
            if (uVar10 == 0) {
              uVar9 = 0xffffffffffffffff;
              break;
            }
            uVar10 = uVar9;
          } while (pwVar13[uVar9] != L'/');
          if (0xfffffffffffffffc < uVar9 - 2) {
            __assert_fail("lit_end > 1 && lit_end != std::wstring_view::npos",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                          ,0x214,"expression_ptr mjs::parser::parse_primary_expression()");
          }
          local_280._0_8_ = (element_type *)(uVar9 - 1);
          if ((element_type *)(uVar8 - 1) < (element_type *)(uVar9 - 1)) {
            local_280._0_8_ = (element_type *)(uVar8 - 1);
          }
          local_280._8_8_ = pwVar13 + 1;
          lVar2 = uVar9 + 1;
          if (uVar8 <= uVar9) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",lVar2,uVar8);
          }
          local_108._0_8_ = uVar8 - lVar2;
          local_108._8_8_ = pwVar13 + lVar2;
          make_expression<mjs::regexp_literal_expression,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                    (this,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)in_RSI,
                     (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_280);
        }
      }
    }
    else {
      make_expression<mjs::this_expression>(this);
    }
  }
  token::destroy((token *)local_2a8);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
LAB_0018e4d0:
  bVar4 = !bVar15;
  bVar15 = bVar16;
  if (bVar4) {
    local_280._0_8_ = (element_type *)0x0;
    std::
    vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
    ::emplace_back<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
                *)local_2d8,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_280);
LAB_0018e4f3:
    bVar15 = bVar16;
    if ((element_type *)local_280._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_280._0_8_ + 8))();
    }
  }
  goto LAB_0018e43a;
}

Assistant:

expression_ptr parse_primary_expression() {
        // PrimaryExpression :
        //  this
        //  Identifier
        //  Literal
        //  ArrayLiteral
        //  ObjectLiteral
        //  ( Expression )
        if (auto id = accept(token_type::identifier)) {
            return make_expression<identifier_expression>(id.text());
        } else if (accept(token_type::this_)) {
            return make_expression<this_expression>();
        } else if (version_ >= version::es3 && accept(token_type::lbracket)) {
            // ArrayLiteral
            std::vector<expression_ptr> elements;
            bool last_was_assignment_expression = false;
            while (!accept(token_type::rbracket)) {
                if (accept(token_type::comma)) {
                    if (!last_was_assignment_expression) {
                        elements.push_back(nullptr);
                    }
                    last_was_assignment_expression = false;
                } else {
                    if (last_was_assignment_expression) {
                        EXPECT(token_type::comma);
                    }
                    elements.push_back(parse_assignment_expression());
                    last_was_assignment_expression = true;
                }
            }
            return make_expression<array_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && accept(token_type::lbrace)) {
            // ObjectLiteral
            property_name_and_value_list elements;
            while (!accept(token_type::rbrace)) {
                if (!elements.empty()) {
                    EXPECT(token_type::comma);
                    if (version_ >= version::es5 && accept(token_type::rbrace)) {
                        // Trailing comma allowed in ES5+
                        break;
                    }
                }
                elements.push_back(parse_property_name_and_value());
                if (version_ >= version::es5) {
                    const auto& new_item = elements.back();
                    const auto new_item_str = new_item.name_str();
                    auto e = elements.end() - 1;
                    auto it = std::find_if(elements.begin(), e, [&](const property_name_and_value& v) {
                        if (v.name_str() != new_item_str) {
                            // Item doesn't match
                            return false;
                        }
                        // Repeated definitions are not allowed for data properties in strict mode
                        if (new_item.type() == property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return strict_mode_;
                        }
                        // May not change a data property to an accessor property or vice versa
                        if (new_item.type() == property_assignment_type::normal && v.type() != property_assignment_type::normal) {
                            return true;
                        }
                        if (new_item.type() != property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return true;
                        }
                        // May only define getter/setter once
                        assert(new_item.type() == property_assignment_type::get || new_item.type() == property_assignment_type::set);
                        assert(v.type() == property_assignment_type::get || v.type() == property_assignment_type::set);
                        return new_item.type() == v.type();
                    });
                    if (it != e) {
                        SYNTAX_ERROR_AT("Invalid redefinition of property: \"" << cpp_quote(new_item_str) << "\"", elements.back().name().extend());
                    }
                }
            }
            return make_expression<object_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && (current_token_type() == token_type::divide || current_token_type() == token_type::divideequal)) {
            // RegularExpressionLiteral
            const auto lit = lexer_.get_regex_literal();
            check_token();
            skip_whitespace();
            assert(lit.size() >= 3);
            assert(lit[0] == '/');
            const auto lit_end = lit.find_last_of('/');
            assert(lit_end > 1 && lit_end != std::wstring_view::npos);
            return make_expression<regexp_literal_expression>(lit.substr(1, lit_end-1), lit.substr(lit_end+1));
        } else if (accept(token_type::lparen)) {
            auto e = parse_expression();
            EXPECT(token_type::rparen);
            return e;
        } else if (is_literal(current_token_type())) {
            check_literal();
            return make_expression<literal_expression>(get_token());
        }
        UNHANDLED();
    }